

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

IT_PLAYING * new_playing(DUMB_IT_SIGRENDERER *itsr)

{
  IT_PLAYING *pIVar1;
  void *_r;
  void *pvVar2;
  
  pIVar1 = itsr->free_playing;
  if (pIVar1 == (IT_PLAYING *)0x0) {
    pIVar1 = (IT_PLAYING *)malloc(0x128);
    if (pIVar1 != (IT_PLAYING *)0x0) {
      (pIVar1->resampler).fir_resampler_ratio = 0.0;
      _r = resampler_create();
      (pIVar1->resampler).fir_resampler[0] = _r;
      if (_r != (void *)0x0) {
        pvVar2 = resampler_create();
        (pIVar1->resampler).fir_resampler[1] = pvVar2;
        if (pvVar2 != (void *)0x0) {
          return pIVar1;
        }
        resampler_delete(_r);
      }
      free(pIVar1);
    }
    pIVar1 = (IT_PLAYING *)0x0;
  }
  else {
    itsr->free_playing = pIVar1->next;
  }
  return pIVar1;
}

Assistant:

static IT_PLAYING *new_playing(DUMB_IT_SIGRENDERER *itsr)
{
	IT_PLAYING *r;

	if (itsr->free_playing != NULL)
	{
		r = itsr->free_playing;
		itsr->free_playing = r->next;
		return r;
	}
	r = (IT_PLAYING *)malloc(sizeof(IT_PLAYING));
	if (r)
	{
		r->resampler.fir_resampler_ratio = 0.0;
		r->resampler.fir_resampler[0] = resampler_create();
		if ( !r->resampler.fir_resampler[0] ) {
			free( r );
			return NULL;
		}
		r->resampler.fir_resampler[1] = resampler_create();
		if ( !r->resampler.fir_resampler[1] ) {
			resampler_delete( r->resampler.fir_resampler[0] );
			free( r );
			return NULL;
		}
	}
	return r;
}